

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

BSDF * __thiscall
pbrt::DielectricMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (undefined8 param_1,ulong param_2,void *param_3,long param_4,long param_5,
          undefined8 *param_6)

{
  TextureEvalContext ctx;
  TextureEvalContext ctx_00;
  TextureEvalContext ctx_01;
  undefined1 auVar1 [64];
  TextureEvalContext ctx_02;
  undefined1 auVar2 [64];
  bool bVar3;
  Float *pFVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [56];
  undefined1 auVar8 [56];
  SampledSpectrum SVar9;
  TrowbridgeReitzDistribution distrib;
  Float vrough;
  Float urough;
  Float eta;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 in_stack_fffffffffffffd98 [64];
  undefined8 in_stack_fffffffffffffde0;
  Float eta_00;
  BxDFHandle *in_stack_fffffffffffffde8;
  Vector3f *in_stack_fffffffffffffdf0;
  Normal3f *in_stack_fffffffffffffdf8;
  Normal3f *n;
  Vector3f *wo;
  BSDF *this;
  FloatTextureHandle *in_stack_fffffffffffffe18;
  UniversalTextureEvaluator *in_stack_fffffffffffffe20;
  undefined1 (*__src) [64];
  undefined1 in_stack_fffffffffffffe48 [12];
  undefined8 in_stack_fffffffffffffe54;
  Float in_stack_fffffffffffffe5c;
  TrowbridgeReitzDistribution in_stack_fffffffffffffe60;
  SpectrumTextureHandle *in_stack_fffffffffffffe68;
  UniversalTextureEvaluator *in_stack_fffffffffffffe70;
  undefined1 auStack_188 [24];
  undefined1 auVar12 [12];
  undefined1 in_stack_fffffffffffffe90 [24];
  undefined1 auVar13 [12];
  undefined1 in_stack_fffffffffffffea8 [12];
  undefined4 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb8 [24];
  array<float,_4> aVar14;
  SampledWavelengths in_stack_fffffffffffffed0;
  array<float,_4> aVar15;
  undefined8 uStack_110;
  UniversalTextureEvaluator local_90 [8];
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78 [64];
  Float local_2c;
  undefined8 *local_28;
  long local_20;
  long local_18;
  void *local_8;
  
  eta_00 = (Float)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  auVar10 = in_stack_fffffffffffffd98._0_16_;
  __src = (undefined1 (*) [64])&stack0x00000008;
  local_28 = param_6;
  local_20 = param_5;
  local_18 = param_4;
  local_8 = param_3;
  bVar3 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(param_4 + 0x18));
  if (bVar3) {
    FloatTextureHandle::FloatTextureHandle(auVar10._8_8_,auVar10._0_8_);
    memcpy(local_78,__src,0x40);
    auVar5 = vmovdqu64_avx512f(local_78);
    auVar5 = vmovdqu64_avx512f(auVar5);
    auVar10 = auVar5._0_16_;
    ctx._8_8_ = __src;
    ctx.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_3;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)param_4;
    ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)param_4 >> 0x20);
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe48._0_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe48._4_4_;
    ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffe48._8_4_;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.x = (Float)in_stack_fffffffffffffe54;
    ctx.uv.super_Tuple2<pbrt::Point2,_float>.y = SUB84(in_stack_fffffffffffffe54,4);
    ctx.dudx = in_stack_fffffffffffffe5c;
    ctx.dudy = in_stack_fffffffffffffe60.alpha_x;
    ctx.dvdx = in_stack_fffffffffffffe60.alpha_y;
    ctx._56_8_ = in_stack_fffffffffffffe68;
    local_2c = UniversalTextureEvaluator::operator()
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,ctx);
  }
  else {
    in_stack_fffffffffffffe20 = local_90;
    SpectrumTextureHandle::SpectrumTextureHandle
              ((SpectrumTextureHandle *)auVar10._8_8_,(SpectrumTextureHandle *)auVar10._0_8_);
    auVar5 = vmovdqu64_avx512f(*__src);
    auVar5 = vmovdqu64_avx512f(auVar5);
    eta_00 = (Float)((ulong)*(undefined8 *)(local_20 + 8) >> 0x20);
    in_stack_fffffffffffffde8 = *(BxDFHandle **)(local_20 + 0x10);
    in_stack_fffffffffffffdf0 = *(Vector3f **)(local_20 + 0x18);
    auVar6 = vmovdqu64_avx512f(auVar5);
    auVar5 = vmovdqu64_avx512f(auVar6);
    auVar10 = auVar5._0_16_;
    auVar7 = ZEXT856(auVar6._8_8_);
    auVar8 = ZEXT856(param_2);
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffea8._0_4_;
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffea8._4_4_;
    ctx_02.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffea8._8_4_;
    auVar12 = in_stack_fffffffffffffe90._0_12_;
    auVar13 = in_stack_fffffffffffffe90._12_12_;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.x = (float)auVar12._0_4_;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.y = (float)auVar12._4_4_;
    ctx_02.p.super_Tuple3<pbrt::Point3,_float>.z = (float)auVar12._8_4_;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar13._0_4_;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)auVar13._4_4_;
    ctx_02.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)auVar13._8_4_;
    ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffeb4;
    ctx_02.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)in_stack_fffffffffffffeb8._0_4_;
    ctx_02.dudx = (Float)in_stack_fffffffffffffeb8._4_4_;
    ctx_02.dudy = (Float)in_stack_fffffffffffffeb8._8_4_;
    ctx_02.dvdx = (Float)in_stack_fffffffffffffeb8._12_4_;
    ctx_02.dvdy = (Float)in_stack_fffffffffffffeb8._16_4_;
    ctx_02.faceIndex = in_stack_fffffffffffffeb8._20_4_;
    SVar9 = UniversalTextureEvaluator::operator()
                      (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,ctx_02,
                       in_stack_fffffffffffffed0);
    auVar6._0_8_ = SVar9.values.values._8_8_;
    auVar6._8_56_ = auVar8;
    auVar5._0_8_ = SVar9.values.values._0_8_;
    auVar5._8_56_ = auVar7;
    local_88 = vmovlpd_avx(auVar5._0_16_);
    local_80 = vmovlpd_avx(auVar6._0_16_);
    pFVar4 = SampledSpectrum::operator[](auVar10._8_8_,auVar10._4_4_);
    local_2c = *pFVar4;
    SampledWavelengths::TerminateSecondary(auVar10._8_8_);
  }
  FloatTextureHandle::FloatTextureHandle(auVar10._8_8_,auVar10._0_8_);
  memcpy(&stack0xfffffffffffffeb8,__src,0x40);
  aVar14 = in_stack_fffffffffffffed0.lambda.values;
  aVar15 = in_stack_fffffffffffffed0.pdf.values;
  auVar2._24_4_ = aVar14.values[0];
  auVar2._28_4_ = aVar14.values[1];
  auVar2._32_4_ = aVar14.values[2];
  auVar2._36_4_ = aVar14.values[3];
  auVar2._40_4_ = aVar15.values[0];
  auVar2._44_4_ = aVar15.values[1];
  auVar2._48_4_ = aVar15.values[2];
  auVar2._52_4_ = aVar15.values[3];
  auVar2._0_24_ = in_stack_fffffffffffffeb8;
  auVar2._56_8_ = uStack_110;
  auVar5 = vmovdqu64_avx512f(auVar2);
  auVar5 = vmovdqu64_avx512f(auVar5);
  auVar10 = auVar5._0_16_;
  ctx_00._8_8_ = __src;
  ctx_00.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_3;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)param_4;
  ctx_00.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)param_4 >> 0x20);
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe48._0_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe48._4_4_;
  ctx_00.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffe48._8_4_;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.x = (Float)in_stack_fffffffffffffe54;
  ctx_00.uv.super_Tuple2<pbrt::Point2,_float>.y = SUB84(in_stack_fffffffffffffe54,4);
  ctx_00.dudx = in_stack_fffffffffffffe5c;
  ctx_00.dudy = in_stack_fffffffffffffe60.alpha_x;
  ctx_00.dvdx = in_stack_fffffffffffffe60.alpha_y;
  ctx_00._56_8_ = in_stack_fffffffffffffe68;
  UniversalTextureEvaluator::operator()(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,ctx_00);
  FloatTextureHandle::FloatTextureHandle(auVar10._8_8_,auVar10._0_8_);
  memcpy(&stack0xfffffffffffffe68,__src,0x40);
  auVar1._8_8_ = in_stack_fffffffffffffe70;
  auVar1._0_8_ = in_stack_fffffffffffffe68;
  auVar1._16_24_ = auStack_188;
  auVar1._40_24_ = in_stack_fffffffffffffe90;
  auVar5 = vmovdqu64_avx512f(auVar1);
  auVar5 = vmovdqu64_avx512f(auVar5);
  auVar11 = auVar5._0_32_;
  ctx_01._8_8_ = __src;
  ctx_01.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = param_3;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)param_4;
  ctx_01.dpdx.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)param_4 >> 0x20);
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe48._0_4_;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffe48._4_4_;
  ctx_01.dpdy.super_Tuple3<pbrt::Vector3,_float>.z = (float)in_stack_fffffffffffffe48._8_4_;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.x = (Float)in_stack_fffffffffffffe54;
  ctx_01.uv.super_Tuple2<pbrt::Point2,_float>.y = SUB84(in_stack_fffffffffffffe54,4);
  ctx_01.dudx = in_stack_fffffffffffffe5c;
  ctx_01.dudy = in_stack_fffffffffffffe60.alpha_x;
  ctx_01.dvdx = in_stack_fffffffffffffe60.alpha_y;
  ctx_01._56_8_ = in_stack_fffffffffffffe68;
  UniversalTextureEvaluator::operator()(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,ctx_01);
  if ((*(byte *)(param_4 + 0x28) & 1) != 0) {
    TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
    TrowbridgeReitzDistribution::RoughnessToAlpha(0.0);
  }
  auVar10 = auVar11._0_16_;
  TrowbridgeReitzDistribution::TrowbridgeReitzDistribution
            (auVar11._24_8_,auVar11._20_4_,auVar11._16_4_);
  DielectricInterfaceBxDF::DielectricInterfaceBxDF
            ((DielectricInterfaceBxDF *)&stack0xfffffffffffffe54,local_2c,
             (TrowbridgeReitzDistribution *)&stack0xfffffffffffffe60);
  *local_28 = in_stack_fffffffffffffe54;
  *(Float *)(local_28 + 1) = in_stack_fffffffffffffe5c;
  n = (Normal3f *)(__src + 1);
  wo = (Vector3f *)(__src[1] + 0xc);
  this = (BSDF *)(__src[1] + 0x18);
  BxDFHandle::TaggedPointer<pbrt::DielectricInterfaceBxDF>(auVar10._8_8_,auVar10._0_8_);
  BSDF::BSDF(this,wo,n,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8
             ,eta_00);
  return (BSDF *)param_3;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, MaterialEvalContext ctx,
                              SampledWavelengths &lambda,
                              DielectricInterfaceBxDF *bxdf) const {
        // Compute index of refraction for dielectric material
        Float eta;
        if (etaF)
            eta = texEval(etaF, ctx);
        else {
            eta = texEval(etaS, ctx, lambda)[0];
            lambda.TerminateSecondary();
        }

        // Create microfacet distribution for \use{DielectricMaterial}
        Float urough = texEval(uRoughness, ctx), vrough = texEval(vRoughness, ctx);
        if (remapRoughness) {
            urough = TrowbridgeReitzDistribution::RoughnessToAlpha(urough);
            vrough = TrowbridgeReitzDistribution::RoughnessToAlpha(vrough);
        }
        TrowbridgeReitzDistribution distrib(urough, vrough);

        // Return BSDF for \use{DielectricMaterial}
        *bxdf = DielectricInterfaceBxDF(eta, distrib);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf, eta);
    }